

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

WhereNonZeroLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::WhereNonZeroLayerParams>
          (Arena *arena)

{
  WhereNonZeroLayerParams *pWVar1;
  
  if (arena != (Arena *)0x0) {
    pWVar1 = DoCreateMessage<CoreML::Specification::WhereNonZeroLayerParams>(arena);
    return pWVar1;
  }
  pWVar1 = (WhereNonZeroLayerParams *)operator_new(0x18);
  CoreML::Specification::WhereNonZeroLayerParams::WhereNonZeroLayerParams(pWVar1,(Arena *)0x0,false)
  ;
  return pWVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }